

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void __thiscall cmRealDirectoryWatcher::StartWatching(cmRealDirectoryWatcher *this)

{
  int iVar1;
  uv_fs_event_t *puVar2;
  undefined4 extraout_var;
  char *local_38 [4];
  
  if (this->Handle == (uv_fs_event_t *)0x0) {
    puVar2 = (uv_fs_event_t *)operator_new(0x88);
    this->Handle = puVar2;
    iVar1 = (*(this->Parent->super_cmIBaseWatcher)._vptr_cmIBaseWatcher[4])();
    uv_fs_event_init((uv_loop_t *)CONCAT44(extraout_var,iVar1),this->Handle);
    puVar2 = this->Handle;
    puVar2->data = this;
    (*(this->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher[3])
              (local_38,this);
    uv_fs_event_start(puVar2,anon_unknown.dwarf_56483::on_directory_change,local_38[0],0);
    std::__cxx11::string::~string((string *)local_38);
  }
  cmVirtualDirectoryWatcher::StartWatching(&this->super_cmVirtualDirectoryWatcher);
  return;
}

Assistant:

void StartWatching() final
  {
    if (!this->Handle) {
      this->Handle = new uv_fs_event_t;

      uv_fs_event_init(this->Loop(), this->Handle);
      this->Handle->data = this;
      uv_fs_event_start(this->Handle, &on_directory_change, Path().c_str(), 0);
    }
    cmVirtualDirectoryWatcher::StartWatching();
  }